

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

t_int * min_perform(t_int *w)

{
  float fVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  tVar2 = w[4];
  if ((int)tVar2 != 0) {
    lVar3 = w[3];
    lVar4 = w[1];
    lVar5 = w[2];
    lVar6 = 0;
    do {
      fVar7 = *(float *)(lVar4 + lVar6 * 4);
      fVar1 = *(float *)(lVar5 + lVar6 * 4);
      if (fVar1 <= fVar7) {
        fVar7 = fVar1;
      }
      *(float *)(lVar3 + lVar6 * 4) = fVar7;
      lVar6 = lVar6 + 1;
    } while ((int)tVar2 != (int)lVar6);
  }
  return w + 5;
}

Assistant:

t_int *min_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample f = *in1++, g = *in2++;
        *out++ = (f < g ? f : g);
    }
    return (w+5);
}